

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vdbeIncrPopulate(IncrMerger *pIncr)

{
  uint nData;
  long lVar1;
  MergeEngine *pMVar2;
  sqlite3_file *psVar3;
  PmaReader *pPVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  u64 v;
  long in_FS_OFFSET;
  PmaWriter writer;
  int dummy;
  PmaWriter local_78;
  int local_44 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = pIncr->iStartOff;
  pMVar2 = pIncr->pMerger;
  psVar3 = pIncr->aFile[1].pFd;
  iVar6 = pIncr->pTask->pSorter->pgsz;
  local_78.iWriteOff = 0;
  local_78.pFd = (sqlite3_file *)0x0;
  local_78.nBuffer = 0;
  local_78.iBufStart = 0;
  local_78.iBufEnd = 0;
  local_78._28_4_ = 0;
  local_78.eFWErr = 0;
  local_78._4_4_ = 0;
  local_78.aBuffer = (u8 *)0x0;
  local_78.aBuffer = (u8 *)sqlite3Malloc((long)iVar6);
  if (local_78.aBuffer == (u8 *)0x0) {
    local_78.eFWErr = 7;
  }
  else {
    local_78.iWriteOff = lVar1 % (long)iVar6;
    iVar7 = (int)local_78.iWriteOff;
    local_78.iBufEnd = iVar7;
    local_78.iWriteOff = lVar1 - local_78.iWriteOff;
    local_78.iBufStart = iVar7;
    local_78.nBuffer = iVar6;
    local_78.pFd = psVar3;
  }
  iVar6 = 0;
  do {
    if (iVar6 != 0) break;
    pPVar4 = pMVar2->aReadr;
    iVar7 = pMVar2->aTree[1];
    if (pPVar4[iVar7].pFd == (sqlite3_file *)0x0) {
      iVar6 = 0;
      bVar5 = false;
    }
    else {
      nData = pPVar4[iVar7].nKey;
      v = (u64)(int)nData;
      lVar8 = 1;
      uVar9 = v;
      if (0x7f < nData) {
        do {
          lVar8 = lVar8 + 1;
          bVar5 = 0x3fff < uVar9;
          uVar9 = uVar9 >> 7;
        } while (bVar5);
      }
      iVar6 = 0;
      bVar5 = false;
      if ((long)(local_78.iWriteOff + v + (long)local_78.iBufEnd + lVar8) <= pIncr->mxSz + lVar1) {
        iVar6 = sqlite3PutVarint((uchar *)local_44,v);
        vdbePmaWriteBlob(&local_78,(u8 *)local_44,iVar6);
        vdbePmaWriteBlob(&local_78,pPVar4[iVar7].aKey,nData);
        iVar6 = vdbeMergeEngineStep(pIncr->pMerger,local_44);
        bVar5 = true;
      }
    }
  } while (bVar5);
  iVar7 = vdbePmaWriterFinish(&local_78,&pIncr->aFile[1].iEof);
  if (iVar6 != 0) {
    iVar7 = iVar6;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar7;
}

Assistant:

static int vdbeIncrPopulate(IncrMerger *pIncr){
  int rc = SQLITE_OK;
  int rc2;
  i64 iStart = pIncr->iStartOff;
  SorterFile *pOut = &pIncr->aFile[1];
  SortSubtask *pTask = pIncr->pTask;
  MergeEngine *pMerger = pIncr->pMerger;
  PmaWriter writer;
  assert( pIncr->bEof==0 );

  vdbeSorterPopulateDebug(pTask, "enter");

  vdbePmaWriterInit(pOut->pFd, &writer, pTask->pSorter->pgsz, iStart);
  while( rc==SQLITE_OK ){
    int dummy;
    PmaReader *pReader = &pMerger->aReadr[ pMerger->aTree[1] ];
    int nKey = pReader->nKey;
    i64 iEof = writer.iWriteOff + writer.iBufEnd;

    /* Check if the output file is full or if the input has been exhausted.
    ** In either case exit the loop. */
    if( pReader->pFd==0 ) break;
    if( (iEof + nKey + sqlite3VarintLen(nKey))>(iStart + pIncr->mxSz) ) break;

    /* Write the next key to the output. */
    vdbePmaWriteVarint(&writer, nKey);
    vdbePmaWriteBlob(&writer, pReader->aKey, nKey);
    assert( pIncr->pMerger->pTask==pTask );
    rc = vdbeMergeEngineStep(pIncr->pMerger, &dummy);
  }

  rc2 = vdbePmaWriterFinish(&writer, &pOut->iEof);
  if( rc==SQLITE_OK ) rc = rc2;
  vdbeSorterPopulateDebug(pTask, "exit");
  return rc;
}